

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_NewUTF32String(JSContext *ctx,uint32_t *buf,int len)

{
  int iVar1;
  int in_EDX;
  StringBuffer *b;
  StringBuffer b_s;
  int i;
  StringBuffer *in_stack_ffffffffffffffa8;
  JSContext *ctx_00;
  undefined1 local_48 [60];
  undefined1 auStack_c [12];
  
  ctx_00 = (JSContext *)local_48;
  local_48._36_4_ = in_EDX;
  iVar1 = string_buffer_init(ctx_00,in_stack_ffffffffffffffa8,0);
  if (iVar1 == 0) {
    for (local_48._32_4_ = 0; (int)local_48._32_4_ < (int)local_48._36_4_;
        local_48._32_4_ = local_48._32_4_ + 1) {
      iVar1 = string_buffer_putc(in_stack_ffffffffffffffa8,0);
      if (iVar1 != 0) {
        string_buffer_free((StringBuffer *)0x16f276);
        stack0xfffffffffffffff0 = (void *)(auStack_c._0_8_ << 0x20);
        auStack_c._4_8_ = 6;
        return stack0xfffffffffffffff0;
      }
    }
    join_0x00000010_0x00000000_ = string_buffer_end((StringBuffer *)ctx_00);
  }
  else {
    stack0xfffffffffffffff0 = (void *)(local_48._60_8_ << 0x20);
    auStack_c._4_8_ = 6;
  }
  return stack0xfffffffffffffff0;
}

Assistant:

static JSValue JS_NewUTF32String(JSContext *ctx, const uint32_t *buf, int len)
{
    int i;
    StringBuffer b_s, *b = &b_s;
    if (string_buffer_init(ctx, b, len))
        return JS_EXCEPTION;
    for(i = 0; i < len; i++) {
        if (string_buffer_putc(b, buf[i]))
            goto fail;
    }
    return string_buffer_end(b);
 fail:
    string_buffer_free(b);
    return JS_EXCEPTION;
}